

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

FArchive * operator<<(FArchive *arc,secspecial_t *p)

{
  FArchive *pFVar1;
  
  pFVar1 = FArchive::operator<<(arc,(WORD *)&p->special);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&p->damageamount);
  pFVar1 = FArchive::operator<<(pFVar1,(FName *)p);
  pFVar1 = FArchive::operator<<(pFVar1,(WORD *)&p->damageinterval);
  pFVar1 = FArchive::operator<<(pFVar1,(WORD *)&p->leakydamage);
  FArchive::operator<<(pFVar1,(DWORD *)&p->Flags);
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, secspecial_t &p)
{
	arc << p.special
		<< p.damageamount
		<< p.damagetype
		<< p.damageinterval
		<< p.leakydamage
		<< p.Flags;
	return arc;
}